

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O0

int live(ps_config_t *config,FILE *infile)

{
  int iVar1;
  long lVar2;
  ps_vad_t *vad;
  __sighandler_t p_Var3;
  size_t local_60;
  size_t end_samples;
  size_t len;
  int16 *piStack_48;
  int prev_in_speech;
  int16 *speech;
  size_t frame_size;
  short *frame;
  ps_endpointer_t *ep;
  ps_decoder_t *decoder;
  FILE *infile_local;
  ps_config_t *config_local;
  
  ep = (ps_endpointer_t *)0x0;
  frame = (short *)0x0;
  frame_size = 0;
  decoder = (ps_decoder_t *)infile;
  infile_local = (FILE *)config;
  ep = (ps_endpointer_t *)ps_init(config);
  if ((ps_decoder_t *)ep == (ps_decoder_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x162,"PocketSphinx decoder init failed\n");
    exit(1);
  }
  lVar2 = ps_config_int((cmd_ln_t *)infile_local,"samprate");
  frame = (short *)ps_endpointer_init(0.0,0.0,PS_VAD_LOOSE,(int)lVar2,0.0);
  if ((ps_endpointer_t *)frame == (ps_endpointer_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x168,"PocketSphinx endpointer init failed\n");
  }
  else {
    vad = ps_endpointer_vad((ps_endpointer_t *)frame);
    speech = (int16 *)ps_vad_frame_size(vad);
    frame_size = (size_t)__ckd_calloc__((size_t)speech,2,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                                        ,0x16c);
    if ((void *)frame_size != (void *)0x0) {
      p_Var3 = signal(2,catch_sig);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                       ,0x171,"Failed to set SIGINT handler");
        exit(1);
      }
      while (global_done == 0) {
        len._4_4_ = ps_endpointer_in_speech((ps_endpointer_t *)frame);
        end_samples = fread((void *)frame_size,2,(size_t)speech,(FILE *)decoder);
        if ((int16 *)end_samples == speech) {
          piStack_48 = ps_endpointer_process((ps_endpointer_t *)frame,(int16 *)frame_size);
        }
        else {
          if ((int16 *)end_samples == (int16 *)0x0) break;
          piStack_48 = ps_endpointer_end_stream
                                 ((ps_endpointer_t *)frame,(int16 *)frame_size,(size_t)speech,
                                  &local_60);
        }
        if (piStack_48 != (int16 *)0x0) {
          if (len._4_4_ == 0) {
            ps_endpointer_speech_start((ps_endpointer_t *)frame);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x184,"Speech start at %.2f\n");
            ps_start_utt((ps_decoder_t *)ep);
          }
          iVar1 = ps_process_raw((ps_decoder_t *)ep,piStack_48,(size_t)speech,0,0);
          if (iVar1 < 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x188,"ps_process_raw() failed\n");
            goto LAB_0010833c;
          }
          iVar1 = ps_endpointer_in_speech((ps_endpointer_t *)frame);
          if (iVar1 == 0) {
            ps_endpointer_speech_end((ps_endpointer_t *)frame);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                    ,0x18d,"Speech end at %.2f\n");
            ps_end_utt((ps_decoder_t *)ep);
            iVar1 = ps_config_bool((ps_config_t *)ep->vad,"phone_align");
            if (iVar1 != 0) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
                      ,400,"Subword alignment not yet supported in live mode\n");
            }
            output_hyp((ps_endpointer_t *)frame,(ps_decoder_t *)ep,(ps_alignment_t *)0x0);
          }
        }
      }
      ckd_free((void *)frame_size);
      ps_endpointer_free((ps_endpointer_t *)frame);
      ps_free((ps_decoder_t *)ep);
      return 0;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_main.c"
            ,0x16d,"Failed to allocate frame");
  }
LAB_0010833c:
  if (frame_size != 0) {
    ckd_free((void *)frame_size);
  }
  if (frame != (short *)0x0) {
    ps_endpointer_free((ps_endpointer_t *)frame);
  }
  if (ep != (ps_endpointer_t *)0x0) {
    ps_free((ps_decoder_t *)ep);
  }
  return -1;
}

Assistant:

static int
live(ps_config_t *config, FILE *infile)
{
    ps_decoder_t *decoder = NULL;
    ps_endpointer_t *ep = NULL;
    short *frame = NULL;
    size_t frame_size;

    if ((decoder = ps_init(config)) == NULL) {
        E_FATAL("PocketSphinx decoder init failed\n");
        goto error_out;
    }
    if ((ep = ps_endpointer_init(0, 0.0,
                                 0, ps_config_int(config, "samprate"),
                                 0)) == NULL) {
        E_ERROR("PocketSphinx endpointer init failed\n");
        goto error_out;
    }
    frame_size = ps_endpointer_frame_size(ep);
    if ((frame = ckd_calloc(frame_size, sizeof(frame[0]))) == NULL) {
        E_ERROR("Failed to allocate frame");
        goto error_out;
    }
    if (signal(SIGINT, catch_sig) == SIG_ERR)
        E_FATAL_SYSTEM("Failed to set SIGINT handler");
    while (!global_done) {
        const int16 *speech;
        int prev_in_speech = ps_endpointer_in_speech(ep);
        size_t len, end_samples;
        if ((len = fread(frame, sizeof(frame[0]),
                         frame_size, infile)) != frame_size) {
            if (len > 0) {
                speech = ps_endpointer_end_stream(ep, frame,
                                                  frame_size,
                                                  &end_samples);
            }
            else
                break;
        } else
            speech = ps_endpointer_process(ep, frame);
        if (speech != NULL) {
            if (!prev_in_speech) {
                E_INFO("Speech start at %.2f\n",
                       ps_endpointer_speech_start(ep));
                ps_start_utt(decoder);
            }
            if (ps_process_raw(decoder, speech, frame_size, FALSE, FALSE) < 0) {
                E_ERROR("ps_process_raw() failed\n");
                goto error_out;
            }
            if (!ps_endpointer_in_speech(ep)) {
                E_INFO("Speech end at %.2f\n",
                       ps_endpointer_speech_end(ep));
                ps_end_utt(decoder);
                if (ps_config_bool(decoder->config, "phone_align"))
                    E_WARN("Subword alignment not yet supported in live mode\n");
                output_hyp(ep, decoder, NULL);
            }
        }
    }
    ckd_free(frame);
    ps_endpointer_free(ep);
    ps_free(decoder);
    return 0;

error_out:
    if (frame)
        ckd_free(frame);
    if (ep)
        ps_endpointer_free(ep);
    if (decoder)
        ps_free(decoder);
    return -1;
}